

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O3

int point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  ulong uVar8;
  uint64_t *puVar9;
  int iVar10;
  uint64_t *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uchar b_y [32];
  uchar b_n [32];
  uchar b_x [32];
  pt_aff_t_conflict P;
  int8_t rnaf [52];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  pt_prj_t_conflict local_188;
  byte local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint64_t local_a8 [4];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  int8_t local_68 [56];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar10 = 0;
  if ((pBVar7 != (BIGNUM *)0x0) && (iVar5 = BN_bn2lebinpad(n,local_128,0x20), iVar5 == 0x20)) {
    local_68[0x20] = '\0';
    local_68[0x21] = '\0';
    local_68[0x22] = '\0';
    local_68[0x23] = '\0';
    local_68[0x24] = '\0';
    local_68[0x25] = '\0';
    local_68[0x26] = '\0';
    local_68[0x27] = '\0';
    local_68[0x28] = '\0';
    local_68[0x29] = '\0';
    local_68[0x2a] = '\0';
    local_68[0x2b] = '\0';
    local_68[0x2c] = '\0';
    local_68[0x2d] = '\0';
    local_68[0x2e] = '\0';
    local_68[0x2f] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = '\0';
    local_68[0x19] = '\0';
    local_68[0x1a] = '\0';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x30] = '\0';
    local_68[0x31] = '\0';
    local_68[0x32] = '\0';
    local_68[0x33] = '\0';
    local_188.Z[2] = 0;
    local_188.Z[3] = 0;
    local_188.Z[0] = 0;
    local_188.Z[1] = 0;
    local_188.Y[2] = 0;
    local_188.Y[3] = 0;
    local_188.Y[0] = 0;
    local_188.Y[1] = 0;
    local_188.X[2] = 0;
    local_188.X[3] = 0;
    local_188.X[0] = 0;
    local_188.X[1] = 0;
    local_198 = ZEXT816(0);
    local_1a8 = ZEXT816(0);
    local_1b8 = ZEXT816(0);
    local_1c8 = ZEXT816(0);
    scalar_rwnaf(local_68,local_128);
    auVar24 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    local_e8._8_8_ = 0xffffffffffffffff;
    local_e8._0_8_ = 0xfffffffffffff367;
    local_d8._8_8_ = 0x7fffffffffffffff;
    local_d8._0_8_ = 0xffffffffffffffff;
    local_c8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    lVar16 = 1;
    auVar25 = (undefined1  [16])0x0;
    auVar26 = (undefined1  [16])0x0;
    auVar18 = (undefined1  [16])0x0;
    do {
      if (lVar16 != 1) {
        iVar10 = 5;
        do {
          point_double((pt_prj_t_conflict *)local_108,(pt_prj_t_conflict *)local_108);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      puVar11 = lut_cmb[0][0].Y;
      lVar12 = 0;
      auVar27 = auVar18;
      do {
        uVar8 = lVar12 * 2 + lVar16;
        if (uVar8 < 0x34) {
          cVar1 = local_68[uVar8];
          cVar2 = cVar1 >> 7;
          lVar13 = 0;
          puVar9 = puVar11;
          do {
            uVar8 = (ulong)((int)((int)(char)(-1 - cVar2) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                                 (uint)lVar13) < 1);
            lVar15 = -uVar8;
            lVar14 = uVar8 - 1;
            auVar18._8_4_ = (int)lVar15;
            auVar18._0_8_ = lVar15;
            auVar18._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar21._8_4_ = (int)lVar14;
            auVar21._0_8_ = lVar14;
            auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar24 = auVar24 & auVar21 |
                      *(undefined1 (*) [16])((pt_aff_t_conflict *)(puVar9 + -4))->X & auVar18;
            auVar25 = auVar25 & auVar21 | *(undefined1 (*) [16])(puVar9 + -2) & auVar18;
            auVar26 = auVar26 & auVar21 | *(undefined1 (*) [16])puVar9 & auVar18;
            auVar27 = auVar27 & auVar21 | auVar18 & *(undefined1 (*) [16])(puVar9 + 2);
            lVar13 = lVar13 + 1;
            puVar9 = puVar9 + 8;
          } while (lVar13 != 0x10);
          uVar8 = ~(long)cVar2;
          local_1c8 = auVar24;
          local_1b8 = auVar25;
          local_1a8 = auVar26;
          local_198 = auVar27;
          fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_opp
                    ((uint64_t *)local_88,(uint64_t *)local_1a8);
          auVar22._0_4_ = (uint)cVar2;
          auVar22._4_4_ = 0;
          auVar22._8_4_ = auVar22._0_4_;
          auVar22._12_4_ = 0;
          auVar23._8_4_ = (int)uVar8;
          auVar23._0_8_ = uVar8;
          auVar23._12_4_ = (int)(uVar8 >> 0x20);
          auVar26 = auVar26 & auVar23 | local_88 & auVar22;
          auVar18 = auVar23 & auVar27 | local_78 & auVar22;
          local_1a8 = auVar26;
          local_198 = auVar18;
          point_add_mixed((pt_prj_t_conflict *)local_108,(pt_prj_t_conflict *)local_108,
                          (pt_aff_t_conflict *)local_1c8);
          auVar27 = auVar18;
        }
        lVar12 = lVar12 + 1;
        puVar11 = puVar11 + 0x80;
      } while (lVar12 != 0x1b);
      bVar17 = lVar16 != 0;
      lVar16 = lVar16 + -1;
    } while (bVar17);
    local_1b8._8_8_ = 0x7fffffffffffffff;
    local_1b8._0_8_ = 0xffffffffffffffff;
    local_1c8._8_8_ = 0xffffffffffffffff;
    local_1c8._0_8_ = 0xfffffffffffff367;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_opp((uint64_t *)local_1a8,lut_cmb[0][0].Y);
    point_add_mixed(&local_188,(pt_prj_t_conflict *)local_108,(pt_aff_t_conflict *)local_1c8);
    lVar12 = -(ulong)(local_128[0] & 1);
    lVar16 = (ulong)(local_128[0] & 1) - 1;
    auVar19._8_4_ = (int)lVar12;
    auVar19._0_8_ = lVar12;
    auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar20._8_4_ = (int)lVar16;
    auVar20._0_8_ = lVar16;
    auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
    auVar26._8_8_ = local_188.X[1];
    auVar26._0_8_ = local_188.X[0];
    local_108 = auVar26 & auVar20 | local_108 & auVar19;
    auVar24._8_8_ = local_188.X[3];
    auVar24._0_8_ = local_188.X[2];
    local_f8 = auVar24 & auVar20 | local_f8 & auVar19;
    auVar25._8_8_ = local_188.Y[1];
    auVar25._0_8_ = local_188.Y[0];
    local_e8 = auVar25 & auVar20 | local_e8 & auVar19;
    auVar27._8_8_ = local_188.Y[3];
    auVar27._0_8_ = local_188.Y[2];
    local_d8 = auVar27 & auVar20 | local_d8 & auVar19;
    auVar3._8_8_ = local_188.Z[1];
    auVar3._0_8_ = local_188.Z[0];
    local_c8 = auVar3 & auVar20 | local_c8 & auVar19;
    auVar4._8_8_ = local_188.Z[3];
    auVar4._0_8_ = local_188.Z[2];
    local_b8 = auVar20 & auVar4 | auVar19 & local_b8;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv((uint64_t *)local_c8,(uint64_t *)local_c8);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
              (local_a8,(uint64_t *)local_108,(uint64_t *)local_c8);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
              ((uint64_t *)local_88,(uint64_t *)local_e8,(uint64_t *)local_c8);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_montgomery(local_a8,local_a8);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_montgomery
              ((uint64_t *)local_88,(uint64_t *)local_88);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_bytes(local_108,local_a8);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_bytes((uint8_t *)&local_188,(uint64_t *)local_88)
    ;
    iVar10 = CRYPTO_memcmp("",local_108,0x20);
    if ((iVar10 == 0) && (iVar10 = CRYPTO_memcmp("",&local_188,0x20), iVar10 == 0)) {
      iVar10 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar10 == 0) {
        iVar10 = 0;
        goto LAB_0010ba26;
      }
    }
    else {
      lVar16 = BN_lebin2bn(local_108,0x20,pBVar6);
      iVar10 = 0;
      if ((lVar16 == 0) ||
         ((lVar16 = BN_lebin2bn(&local_188,0x20,pBVar7), lVar16 == 0 ||
          (iVar5 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar5 == 0))))
      goto LAB_0010ba26;
    }
    iVar10 = 1;
  }
LAB_0010ba26:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar10;
}

Assistant:

int
    point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet(const EC_GROUP *group,
                                                       EC_POINT *r,
                                                       const BIGNUM *n,
                                                       BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 32) != 32)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}